

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O0

void __thiscall MIDIStreamer::StartPlayback(MIDIStreamer *this)

{
  int iVar1;
  int res;
  MIDIStreamer *this_local;
  
  (*(this->super_MusInfo)._vptr_MusInfo[0x1a])();
  this->LoopLimit = 0;
  iVar1 = (*this->MIDI->_vptr_MIDIDevice[7])(this->MIDI,(ulong)(uint)this->Division);
  if (iVar1 == 0) {
    this->Tempo = this->InitialTempo;
    iVar1 = (*this->MIDI->_vptr_MIDIDevice[6])();
    if (iVar1 == 0) {
      (*(this->super_MusInfo)._vptr_MusInfo[2])();
      OutputVolume(this,this->Volume);
      this->BufferNum = 0;
      while( true ) {
        iVar1 = FillBuffer(this,this->BufferNum,0x80,100000);
        if (iVar1 != 0) {
          if (iVar1 == 1) {
            (*(this->super_MusInfo)._vptr_MusInfo[7])();
            return;
          }
          (*(this->super_MusInfo)._vptr_MusInfo[7])();
          return;
        }
        iVar1 = (*this->MIDI->_vptr_MIDIDevice[9])(this->MIDI,this->Buffer + this->BufferNum);
        if (iVar1 != 0) break;
        this->BufferNum = this->BufferNum ^ 1;
        if (this->BufferNum == 0) {
          return;
        }
      }
      Printf("Initial midiStreamOut failed\n");
      (*(this->super_MusInfo)._vptr_MusInfo[7])();
      return;
    }
  }
  Printf(200,"Setting MIDI stream speed failed\n");
  (*this->MIDI->_vptr_MIDIDevice[3])();
  return;
}

Assistant:

void MIDIStreamer::StartPlayback()
{
	Precache();
	LoopLimit = 0;

	// Set time division and tempo.
	if (0 != MIDI->SetTimeDiv(Division) ||
		0 != MIDI->SetTempo(Tempo = InitialTempo))
	{
		Printf(PRINT_BOLD, "Setting MIDI stream speed failed\n");
		MIDI->Close();
		return;
	}

	MusicVolumeChanged();	// set volume to current music's properties
	OutputVolume(Volume);

#ifdef _WIN32
	ResetEvent(ExitEvent);
	ResetEvent(BufferDoneEvent);
#endif

	// Fill the initial buffers for the song.
	BufferNum = 0;
	do
	{
		int res = FillBuffer(BufferNum, MAX_EVENTS, MAX_TIME);
		if (res == SONG_MORE)
		{
			if (0 != MIDI->StreamOutSync(&Buffer[BufferNum]))
			{
				Printf ("Initial midiStreamOut failed\n");
				Stop();
				return;
			}
			BufferNum ^= 1;
		}
		else if (res == SONG_DONE)
		{
			// Do not play super short songs that can't fill the initial two buffers.
			Stop();
			return;
		}
		else
		{
			Stop();
			return;
		}
	}
	while (BufferNum != 0);
}